

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall
UdpSocket::Implementation::Connect(Implementation *this,IpEndpointName *remoteEndpoint)

{
  int iVar1;
  runtime_error *this_00;
  
  SockaddrFromIpEndpointName(&this->connectedAddr_,remoteEndpoint);
  iVar1 = connect(this->socket_,(sockaddr *)&this->connectedAddr_,0x10);
  if (-1 < iVar1) {
    this->isConnected_ = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unable to connect udp socket\n");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Connect( const IpEndpointName& remoteEndpoint )
	{
		SockaddrFromIpEndpointName( connectedAddr_, remoteEndpoint );
       
        if (connect(socket_, (struct sockaddr *)&connectedAddr_, sizeof(connectedAddr_)) < 0) {
            throw std::runtime_error("unable to connect udp socket\n");
        }

		isConnected_ = true;
	}